

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

void __thiscall kj::ArrayInputStream::skip(ArrayInputStream *this,size_t bytes)

{
  undefined8 start;
  bool bVar1;
  size_t end;
  ArrayPtr<const_unsigned_char> AVar2;
  uchar *local_78;
  size_t local_70;
  Fault local_58;
  Fault f;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_unsigned_long_&> _kjCondition;
  size_t bytes_local;
  ArrayInputStream *this_local;
  
  _kjCondition._32_8_ = bytes;
  f.exception = (Exception *)ArrayPtr<const_unsigned_char>::size(&this->array);
  local_48 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(unsigned_long *)&f);
  kj::_::DebugExpression<unsigned_long>::operator>=
            ((DebugComparison<unsigned_long,_unsigned_long_&> *)local_40,&local_48,
             (unsigned_long *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long&>&,char_const(&)[36]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
               ,0x102,FAILED,"array.size() >= bytes",
               "_kjCondition,\"ArrayInputStream ended prematurely.\"",
               (DebugComparison<unsigned_long,_unsigned_long_&> *)local_40,
               (char (*) [36])"ArrayInputStream ended prematurely.");
    _kjCondition._32_8_ = ArrayPtr<const_unsigned_char>::size(&this->array);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  start = _kjCondition._32_8_;
  end = ArrayPtr<const_unsigned_char>::size(&this->array);
  AVar2 = ArrayPtr<const_unsigned_char>::slice(&this->array,start,end);
  local_78 = AVar2.ptr;
  (this->array).ptr = local_78;
  local_70 = AVar2.size_;
  (this->array).size_ = local_70;
  return;
}

Assistant:

void ArrayInputStream::skip(size_t bytes) {
  KJ_REQUIRE(array.size() >= bytes, "ArrayInputStream ended prematurely.") {
    bytes = array.size();
    break;
  }
  array = array.slice(bytes, array.size());
}